

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::Type::BasicType,std::allocator<wasm::Type::BasicType>>>
          (Random *this,vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_> *vec)

{
  pointer pBVar1;
  pointer pBVar2;
  uint32_t uVar3;
  
  pBVar1 = (vec->super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (vec->super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar1 != pBVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)pBVar2 - (long)pBVar1) >> 2));
    return (vec->super__Vector_base<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>).
           _M_impl.super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::Type::BasicType>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }